

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeGravityForces
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fg,ChVector<double> *G_acc)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 (*pauVar13) [64];
  long lVar14;
  SrcEvaluatorType srcEvaluator;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar12 = _DAT_0099e840;
  auVar11 = _DAT_0099e800;
  auVar10 = _DAT_0099e7c0;
  auVar9 = _DAT_0099e780;
  auVar8 = _DAT_0099e740;
  auVar7 = _DAT_0099e700;
  if ((Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows == 0x60)
  {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = G_acc->m_data[0];
    auVar15 = vbroadcastsd_avx512f(auVar4);
    auVar19 = *(undefined1 (*) [64])
               (this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
    ;
    pauVar13 = (undefined1 (*) [64])
               (Fg->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
    ;
    lVar14 = 0;
    local_380 = vmulpd_avx512f(auVar19,auVar15);
    auVar17 = *(undefined1 (*) [64])
               ((this->m_GravForceScale).
                super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
                array + 8);
    local_340 = vmulpd_avx512f(auVar17,auVar15);
    auVar18 = *(undefined1 (*) [64])
               ((this->m_GravForceScale).
                super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.
                array + 0x10);
    local_300 = vmulpd_avx512f(auVar15,auVar18);
    auVar3 = *(undefined1 (*) [64])
              ((this->m_GravForceScale).
               super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>.m_storage.m_data.array
              + 0x18);
    local_2c0 = vmulpd_avx512f(auVar15,auVar3);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = G_acc->m_data[1];
    auVar15 = vbroadcastsd_avx512f(auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = G_acc->m_data[2];
    auVar16 = vbroadcastsd_avx512f(auVar6);
    local_280 = vmulpd_avx512f(auVar19,auVar15);
    local_240 = vmulpd_avx512f(auVar17,auVar15);
    local_200 = vmulpd_avx512f(auVar18,auVar15);
    local_1c0 = vmulpd_avx512f(auVar3,auVar15);
    local_180 = vmulpd_avx512f(auVar19,auVar16);
    local_140 = vmulpd_avx512f(auVar17,auVar16);
    local_100 = vmulpd_avx512f(auVar18,auVar16);
    local_c0 = vmulpd_avx512f(auVar3,auVar16);
    do {
      lVar1 = lVar14 * 8;
      lVar2 = lVar14 * 8;
      auVar19 = *(undefined1 (*) [64])(local_180 + lVar14 * 8);
      lVar14 = lVar14 + 8;
      vpermt2pd_avx512f(auVar7,*(undefined1 (*) [64])(local_280 + lVar2));
      vpermt2pd_avx512f(auVar9,*(undefined1 (*) [64])(local_280 + lVar2));
      vpermt2pd_avx512f(auVar11,*(undefined1 (*) [64])(local_380 + lVar1));
      auVar17 = vpermt2pd_avx512f(auVar8,auVar19);
      auVar18 = vpermt2pd_avx512f(auVar10,auVar19);
      auVar19 = vpermt2pd_avx512f(auVar12,auVar19);
      pauVar13[2] = auVar19;
      pauVar13[1] = auVar18;
      *pauVar13 = auVar17;
      pauVar13 = pauVar13 + 3;
    } while (lVar14 != 0x20);
    return;
  }
  __assert_fail("Fg.size() == 3 * NSF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3843.cpp"
                ,0x1f2,
                "virtual void chrono::fea::ChElementHexaANCF_3843::ComputeGravityForces(ChVectorDynamic<> &, const ChVector<> &)"
               );
}

Assistant:

void ChElementHexaANCF_3843::ComputeGravityForces(ChVectorDynamic<>& Fg, const ChVector<>& G_acc) {
    assert(Fg.size() == 3 * NSF);

    // Calculate and add the generalized force due to gravity to the generalized internal force vector for the element.
    // The generalized force due to gravity could be computed once prior to the start of the simulation if gravity was
    // assumed constant throughout the entire simulation.  However, this implementation assumes that the acceleration
    // due to gravity, while a constant for the entire system, can change from step to step which could be useful for
    // gravity loaded units tests as an example.  The generalized force due to gravity is calculated in compact matrix
    // form and is pre-mapped to the desired vector format
    Eigen::Map<MatrixNx3> GravForceCompact(Fg.data(), NSF, 3);
    GravForceCompact = m_GravForceScale * G_acc.eigen().transpose();
}